

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O3

void stl_string_pointer_is_not_null(void)

{
  string *psVar1;
  Constraint_ *pCVar2;
  
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,"bob","");
  bob_pointer_abi_cxx11_ = psVar1;
  pCVar2 = (Constraint_ *)create_not_null_constraint();
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x9f,"bob_pointer",(string *)psVar1,pCVar2);
  return;
}

Assistant:

Ensure(stl_string_pointer_is_not_null) {
    bob_pointer = new std::string("bob");

    assert_that(bob_pointer, is_non_null);
}